

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O2

void group_copy(Am_Object *self)

{
  Am_Object_Demon *pAVar1;
  Am_Object in_stack_ffffffffffffffc8;
  Am_Object local_30;
  Am_Object local_28;
  Am_Demon_Set local_20;
  
  Am_Object_Advanced::Get_Demons((Am_Object_Advanced *)&local_20);
  pAVar1 = Am_Demon_Set::Get_Object_Demon(&local_20,Am_COPY_OBJ);
  Am_Demon_Set::~Am_Demon_Set(&local_20);
  Am_Object::Am_Object(&local_28,self);
  (*pAVar1)(in_stack_ffffffffffffffc8);
  Am_Object::~Am_Object(&local_28);
  Am_Object::Am_Object(&local_30,self);
  am_generic_renew_copied_comp(&local_30);
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

void
group_copy(Am_Object self)
{
  Am_Object_Demon *copy_demon = ((Am_Object_Advanced &)Am_Aggregate)
                                    .Get_Demons()
                                    .Get_Object_Demon(Am_COPY_OBJ);
  copy_demon(self);
  am_generic_renew_copied_comp(self);
}